

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::BlendCase::deinit(BlendCase *this)

{
  QuadRenderer *this_00;
  TextureLevel *this_01;
  
  this_00 = this->m_renderer;
  if (this_00 != (QuadRenderer *)0x0) {
    deqp::gls::FragmentOpUtil::QuadRenderer::~QuadRenderer(this_00);
  }
  operator_delete(this_00,0x20);
  operator_delete(this->m_referenceRenderer,0x11108);
  this_01 = this->m_refColorBuffer;
  if (this_01 != (TextureLevel *)0x0) {
    tcu::TextureLevel::~TextureLevel(this_01);
  }
  operator_delete(this_01,0x28);
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  return;
}

Assistant:

void BlendCase::deinit (void)
{
	delete m_renderer;
	delete m_referenceRenderer;
	delete m_refColorBuffer;

	m_renderer			= DE_NULL;
	m_referenceRenderer	= DE_NULL;
	m_refColorBuffer	= DE_NULL;
}